

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_astDataType *
build_function_datatype
          (Context_conflict *ctx,MOJOSHADER_astDataType *rettype,int paramcount,
          MOJOSHADER_astDataType **params,int intrinsic)

{
  int iVar1;
  void *pvVar2;
  void *ptr;
  MOJOSHADER_astDataType *local_38;
  
  if (paramcount < 1) {
    pvVar2 = (void *)0x0;
  }
  else {
    local_38 = rettype;
    ptr = Malloc(ctx,(ulong)(uint)paramcount << 3);
    if (ptr == (void *)0x0) {
      return (MOJOSHADER_astDataType *)0x0;
    }
    iVar1 = buffer_append(ctx->garbage,&ptr,8);
    pvVar2 = ptr;
    if (iVar1 == 0) {
      pvVar2 = ctx->malloc_data;
      goto LAB_0012bf66;
    }
    memcpy(ptr,params,(ulong)(uint)paramcount << 3);
    rettype = local_38;
  }
  ptr = Malloc(ctx,0x20);
  if (ptr == (void *)0x0) {
    return (MOJOSHADER_astDataType *)0x0;
  }
  iVar1 = buffer_append(ctx->garbage,&ptr,8);
  if (iVar1 != 0) {
    *(undefined4 *)ptr = 0x15;
    *(MOJOSHADER_astDataType **)((long)ptr + 8) = rettype;
    *(void **)((long)ptr + 0x10) = pvVar2;
    *(int *)((long)ptr + 0x18) = paramcount;
    *(int *)((long)ptr + 0x1c) = intrinsic;
    return (MOJOSHADER_astDataType *)ptr;
  }
  pvVar2 = ctx->malloc_data;
LAB_0012bf66:
  (*ctx->free)(ptr,pvVar2);
  return (MOJOSHADER_astDataType *)0x0;
}

Assistant:

static const MOJOSHADER_astDataType *build_function_datatype(Context *ctx,
                                        const MOJOSHADER_astDataType *rettype,
                                        const int paramcount,
                                        const MOJOSHADER_astDataType **params,
                                        const int intrinsic)
{
    const MOJOSHADER_astDataType **dtparams = NULL;
    void *ptr;

    if (paramcount > 0)
    {
        // !!! FIXME: this is hacky.
        ptr = Malloc(ctx, sizeof (*params) * paramcount);
        if (ptr == NULL)
            return NULL;
        if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
        {
            Free(ctx, ptr);
            return NULL;
        } // if
        dtparams = (const MOJOSHADER_astDataType **) ptr;
        memcpy(dtparams, params, sizeof (*params) * paramcount);
    }

    ptr = Malloc(ctx, sizeof (MOJOSHADER_astDataType));
    if (ptr == NULL)
        return NULL;
    if (!buffer_append(ctx->garbage, &ptr, sizeof (ptr)))
    {
        Free(ctx, ptr);
        return NULL;
    } // if

    MOJOSHADER_astDataType *dt = (MOJOSHADER_astDataType *) ptr;
    dt->type = MOJOSHADER_AST_DATATYPE_FUNCTION;
    dt->function.retval = rettype;
    dt->function.params = dtparams;
    dt->function.num_params = paramcount;
    dt->function.intrinsic = intrinsic;
    return dt;
}